

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkOptionsCommand.cxx
# Opt level: O2

void __thiscall
cmTargetLinkOptionsCommand::HandleMissingTarget(cmTargetLinkOptionsCommand *this,string *name)

{
  cmMakefile *this_00;
  ostream *poVar1;
  string local_1b0;
  ostringstream e;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar1 = std::operator<<((ostream *)&e,"Cannot specify link options for target \"");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"\" which is not built by this project.");
  this_00 = (this->super_cmTargetPropCommandBase).super_cmCommand.Makefile;
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmTargetLinkOptionsCommand::HandleMissingTarget(const std::string& name)
{
  std::ostringstream e;
  e << "Cannot specify link options for target \"" << name
    << "\" which is not built by this project.";
  this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
}